

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>_>
      *this)

{
  Fad<double> *in_RDI;
  Fad<double> *this_00;
  Fad<double> *in_stack_ffffffffffffffb0;
  Fad<double> *in_stack_ffffffffffffffb8;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *in_stack_ffffffffffffffc8;
  Fad<double> *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::val
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)in_RDI);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>
  ::val((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>
         *)in_RDI);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  Fad<double>::Fad<FadBinaryMul<Fad<double>,Fad<double>>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)this_00);
  Fad<double>::~Fad(this_00);
  Fad<double>::~Fad(this_00);
  return this_00;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}